

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::endStep(Solver *this,uint32 top,SolverParams *params)

{
  bool bVar1;
  ValueRep VVar2;
  size_type sVar3;
  Var VVar4;
  uint *puVar5;
  PostPropagator *pPVar6;
  Solver *pSVar7;
  reference pLVar8;
  SolverParams *in_RDX;
  Solver *in_RDI;
  DBInfo DVar9;
  ConstraintDB *in_stack_00000010;
  uint32 in_stack_0000001c;
  Solver *in_stack_00000020;
  Literal u;
  uint32 end;
  Solver *m;
  Solver *in_stack_00000050;
  PostPropagator *pp;
  Literal x;
  Literal *in_stack_ffffffffffffff78;
  Var in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff98;
  Type in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  Literal in_stack_ffffffffffffffa4;
  uint32 in_stack_ffffffffffffffa8;
  uint32 in_stack_ffffffffffffffac;
  ReduceStrategy in_stack_ffffffffffffffb0;
  Literal in_stack_ffffffffffffffb4;
  Literal local_48;
  uint32 in_stack_ffffffffffffffbc;
  Solver *in_stack_ffffffffffffffc0;
  uint local_28;
  Literal local_24;
  SolverParams *local_20;
  uint local_14 [5];
  
  *(uint *)&in_RDI->field_0x204 = *(uint *)&in_RDI->field_0x204 & 0x7fffffff;
  local_20 = in_RDX;
  rootLevel(in_RDI);
  bVar1 = popRootLevel(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                       (LitVec *)CONCAT44(in_stack_ffffffffffffffb4.rep_,in_stack_ffffffffffffffb0),
                       SUB41(in_stack_ffffffffffffffac >> 0x18,0));
  if (!bVar1) {
    return false;
  }
  popAuxVar(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  local_24 = SharedContext::stepLiteral(in_RDI->shared_);
  local_28 = *(uint *)&in_RDI->field_0x204 & 0x3fffffff;
  puVar5 = std::min<unsigned_int>(local_14,&local_28);
  local_14[0] = *puVar5;
  pPVar6 = getPost((Solver *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (pPVar6 != (PostPropagator *)0x0) {
    (*(pPVar6->super_Constraint)._vptr_Constraint[5])(pPVar6,in_RDI,1);
  }
  Literal::var(&local_24);
  VVar2 = value((Solver *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (Var)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (VVar2 == '\0') {
    Literal::operator~(in_stack_ffffffffffffff78);
    bVar1 = force((Solver *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  in_stack_ffffffffffffffa4);
    in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
    if (!bVar1) goto LAB_001e76b4;
  }
  bVar1 = simplify(in_RDI);
  uVar10 = in_stack_ffffffffffffff84 & 0xffffff;
  in_stack_ffffffffffffff84 = uVar10;
  if (bVar1) {
    pSVar7 = SharedContext::master((SharedContext *)0x1e768f);
    in_stack_ffffffffffffff84 = uVar10 & 0xffffff;
    if (in_RDI != pSVar7) {
      bVar1 = SharedContext::ok((SharedContext *)
                                (CONCAT44(uVar10,in_stack_ffffffffffffff80) & 0xffffffffffffff));
      in_stack_ffffffffffffff84 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff84);
    }
  }
LAB_001e76b4:
  if ((char)(in_stack_ffffffffffffff84 >> 0x18) != '\0') {
    SharedContext::master((SharedContext *)0x1e76cf);
    sVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                      (&(in_RDI->assign_).trail);
    for (; local_14[0] < sVar3; local_14[0] = local_14[0] + 1) {
      pLVar8 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (&(in_RDI->assign_).trail,local_14[0]);
      local_48.rep_ = pLVar8->rep_;
      in_stack_ffffffffffffff80 = Literal::var(&local_48);
      VVar4 = Literal::var(&local_24);
      if ((in_stack_ffffffffffffff80 != VVar4) &&
         (in_stack_ffffffffffffffb4.rep_ = local_48.rep_,
         bVar1 = force((Solver *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffffa4), !bVar1)) break;
    }
  }
  bVar1 = SolverParams::forgetLearnts(local_20);
  if (bVar1) {
    ReduceStrategy::ReduceStrategy((ReduceStrategy *)&stack0xffffffffffffffb0);
    DVar9 = reduceLearnts(in_stack_00000050,m._4_4_,_u);
    in_stack_ffffffffffffffac = DVar9.pinned;
    in_stack_ffffffffffffffa4.rep_ = DVar9.size;
    in_stack_ffffffffffffffa8 = DVar9.locked;
  }
  bVar1 = SolverParams::forgetHeuristic(local_20);
  if (bVar1) {
    resetHeuristic((Solver *)CONCAT44(in_stack_ffffffffffffffb4.rep_,in_stack_ffffffffffffffb0),
                   (Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (DecisionHeuristic *)
                   CONCAT44(in_stack_ffffffffffffffa4.rep_,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
  }
  bVar1 = SolverParams::forgetSigns(local_20);
  if (bVar1) {
    resetPrefs((Solver *)0x1e77ec);
  }
  bVar1 = SolverParams::forgetActivities(local_20);
  if (bVar1) {
    resetLearntActivities((Solver *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  return true;
}

Assistant:

bool Solver::endStep(uint32 top, const SolverParams& params) {
	initPost_ = 0; // defer calls to PostPropagator::init()
	if (!popRootLevel(rootLevel())) { return false; }
	popAuxVar();
	Literal x = shared_->stepLiteral();
	top = std::min(top, (uint32)lastSimp_);
	if (PostPropagator* pp = getPost(PostPropagator::priority_reserved_look)) {
		pp->destroy(this, true);
	}
	if ((value(x.var()) != value_free || force(~x)) && simplify() && this != shared_->master() && shared_->ok()) {
		Solver& m = *shared_->master();
		for (uint32 end = (uint32)assign_.trail.size(); top < end; ++top) {
			Literal u = assign_.trail[top];
			if (u.var() != x.var() && !m.force(u)) { break; }
		}
	}
	if (params.forgetLearnts())   { reduceLearnts(1.0f); }
	if (params.forgetHeuristic()) { resetHeuristic(this); }
	if (params.forgetSigns())     { resetPrefs(); }
	if (params.forgetActivities()){ resetLearntActivities(); }
	return true;
}